

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

void __thiscall CTcParser::init_local_ctx(CTcParser *this)

{
  int iVar1;
  
  if ((this->field_0x1e8 & 1) == 0) {
    this->field_0x1e8 = this->field_0x1e8 | 1;
    iVar1 = this->local_cnt_;
    if (this->max_local_cnt_ <= iVar1) {
      this->max_local_cnt_ = iVar1 + 1;
    }
    this->local_cnt_ = iVar1 + 1;
    this->local_ctx_var_num_ = iVar1;
  }
  return;
}

Assistant:

void CTcParser::init_local_ctx()
{
    /* if I already have a local variable context, there's nothing to do */
    if (has_local_ctx_)
        return;

    /* note that we now require a local variable context object */
    has_local_ctx_ = TRUE;

    /* create the local context variable */
    local_ctx_var_num_ = alloc_local();
}